

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

QDebug operator<<(QDebug *d,QAction *action)

{
  bool bVar1;
  QAction *this;
  QDebug *o;
  long in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_fffffffffffffef8;
  char in_stack_fffffffffffffeff;
  QAction *in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  MenuRole value;
  QDebug *in_stack_ffffffffffffff18;
  QDebug local_80;
  QDebug local_78 [13];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffff18,(char *)in_RSI);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,
                     (void *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  if (in_RDX != 0) {
    this = (QAction *)QDebug::operator<<(in_stack_ffffffffffffff18,(char *)in_RSI);
    QAction::text(this);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08);
    QString::~QString((QString *)0x977da4);
    QAction::toolTip((QAction *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    bVar1 = QString::isEmpty((QString *)0x977dc3);
    QString::~QString((QString *)0x977dd6);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QDebug::operator<<(in_stack_ffffffffffffff18,(char *)in_RSI);
      QAction::toolTip((QAction *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff08);
      QString::~QString((QString *)0x977e27);
    }
    bVar1 = QAction::isCheckable(in_stack_ffffffffffffff00);
    if (bVar1) {
      in_stack_ffffffffffffff18 = QDebug::operator<<(in_stack_ffffffffffffff18,(char *)in_RSI);
      QAction::isChecked(in_stack_ffffffffffffff00);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
    }
    QAction::shortcuts((QAction *)in_stack_ffffffffffffff08);
    bVar1 = QList<QKeySequence>::isEmpty((QList<QKeySequence> *)0x977e86);
    value = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff14) ^ 0xff000000;
    QList<QKeySequence>::~QList((QList<QKeySequence> *)0x977e99);
    if ((value & 0x1000000) != NoRole) {
      o = QDebug::operator<<(in_stack_ffffffffffffff18,(char *)in_RSI);
      QDebug::QDebug(&local_80,o);
      QAction::shortcuts((QAction *)in_stack_ffffffffffffff08);
      operator<<(in_stack_ffffffffffffff18,
                 (QList<QKeySequence> *)CONCAT44(value,in_stack_ffffffffffffff10));
      QDebug::~QDebug(local_78);
      QList<QKeySequence>::~QList((QList<QKeySequence> *)0x977f04);
      QDebug::~QDebug(&local_80);
    }
    QDebug::operator<<(in_stack_ffffffffffffff18,(char *)in_RSI);
    QAction::menuRole(in_stack_ffffffffffffff00);
    QtDebugUtils::formatQEnum<QAction::MenuRole>(in_stack_ffffffffffffff18,value);
    in_stack_ffffffffffffff00 =
         (QAction *)QDebug::operator<<(in_stack_ffffffffffffff18,(char *)in_RSI);
    QAction::isEnabled(in_stack_ffffffffffffff00);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
    QDebug::operator<<(in_stack_ffffffffffffff18,(char *)in_RSI);
    QAction::isVisible(in_stack_ffffffffffffff00);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
  QDebug::QDebug((QDebug *)in_stack_ffffffffffffff00,
                 (QDebug *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug d, const QAction *action)
{
    QDebugStateSaver saver(d);
    d.nospace();
    d << "QAction(" << static_cast<const void *>(action);
    if (action) {
        d << " text=" << action->text();
        if (!action->toolTip().isEmpty())
            d << " toolTip=" << action->toolTip();
        if (action->isCheckable())
            d << " checked=" << action->isChecked();
#if QT_CONFIG(shortcut)
        if (!action->shortcuts().isEmpty())
            d << " shortcuts=" << action->shortcuts();
#endif
        d << " menuRole=";
        QtDebugUtils::formatQEnum(d, action->menuRole());
        d << " enabled=" << action->isEnabled();
        d << " visible=" << action->isVisible();
    }
    d << ')';
    return d;
}